

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O0

void composition_solid_destination_over
               (uint32_t *dest,int length,uint32_t color,uint32_t const_alpha)

{
  uint uVar1;
  uint32_t uVar2;
  int local_20;
  uint32_t d;
  int i;
  uint32_t const_alpha_local;
  uint32_t color_local;
  int length_local;
  uint32_t *dest_local;
  
  i = color;
  if (const_alpha != 0xff) {
    i = BYTE_MUL(color,const_alpha);
  }
  for (local_20 = 0; local_20 < length; local_20 = local_20 + 1) {
    uVar1 = dest[local_20];
    uVar2 = BYTE_MUL(i,(uVar1 ^ 0xffffffff) >> 0x18);
    dest[local_20] = uVar1 + uVar2;
  }
  return;
}

Assistant:

static void composition_solid_destination_over(uint32_t* dest, int length, uint32_t color, uint32_t const_alpha)
{
    if(const_alpha != 255)
        color = BYTE_MUL(color, const_alpha);
    for(int i = 0; i < length; i++) {
        uint32_t d = dest[i];
        dest[i] = d + BYTE_MUL(color, plutovg_alpha(~d));
    }
}